

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::basic_substring<const_char>::last_not_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  char *pcVar1;
  code *pcVar2;
  error_flags eVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  
  if (start <= this->len || start == 0xffffffffffffffff) {
    uVar4 = this->len;
    if (start != 0xffffffffffffffff) {
      uVar4 = start;
    }
    do {
      bVar6 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar6) {
        return uVar4;
      }
      sVar5 = 0;
      do {
        if (chars.len == sVar5) {
          return uVar4;
        }
        pcVar1 = chars.str + sVar5;
        sVar5 = sVar5 + 1;
      } while (this->str[uVar4] != *pcVar1);
    } while( true );
  }
  eVar3 = get_error_flags();
  if (((eVar3 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
    pcVar2 = (code *)swi(3);
    sVar5 = (*pcVar2)();
    return sVar5;
  }
  handle_error(0x22b919,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x176c,"start == npos || (start >= 0 && start <= len)");
}

Assistant:

size_t last_not_of(ro_substr chars, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }